

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::my_merge_quads_to_grids(SceneGraph *this,Ref<embree::SceneGraph::Node> *node)

{
  ulong uVar1;
  pointer *ppGVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  Node *pNVar5;
  long *plVar6;
  iterator __position;
  pointer pvVar7;
  size_t sVar8;
  byte bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  pointer puVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  long *plVar18;
  GridMeshNode *pGVar19;
  size_type sVar20;
  RTCGeometry pRVar21;
  undefined8 uVar22;
  long lVar23;
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  *this_00;
  Vec3fa *pVVar24;
  Vec3fa *pVVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  undefined2 uVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  size_t size;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  int iVar36;
  ulong uVar37;
  uint edge;
  GridMeshNode *local_278;
  long *local_270;
  Vec3fa *local_268;
  RTCGeometry local_260;
  ulong local_258;
  vector<bool,_std::allocator<bool>_> local_250;
  Ref<embree::SceneGraph::MaterialNode> local_228;
  Ref<embree::SceneGraph::Node> local_220;
  Ref<embree::SceneGraph::Node> local_218;
  Ref<embree::SceneGraph::Node> local_210;
  avector<Vec3fa> local_208;
  Node *local_1e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> faces;
  deque<unsigned_int,_std::allocator<unsigned_int>_> left;
  deque<unsigned_int,_std::allocator<unsigned_int>_> bottom;
  deque<unsigned_int,_std::allocator<unsigned_int>_> top;
  deque<unsigned_int,_std::allocator<unsigned_int>_> right;
  
  pNVar5 = node->ptr;
  if (pNVar5 != (Node *)0x0) {
    plVar18 = (long *)__dynamic_cast(pNVar5,&Node::typeinfo,&TransformNode::typeinfo,0);
    if (plVar18 == (long *)0x0) {
      plVar18 = (long *)__dynamic_cast(pNVar5,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
      if (plVar18 == (long *)0x0) {
        plVar18 = (long *)__dynamic_cast(pNVar5,&Node::typeinfo,&GroupNode::typeinfo,0);
        local_1e8 = (Node *)this;
        if (plVar18 == (long *)0x0) {
          plVar18 = (long *)__dynamic_cast(pNVar5,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          if (plVar18 != (long *)0x0) {
            (**(code **)(*plVar18 + 0x10))(plVar18);
            local_270 = plVar18;
            pGVar19 = (GridMeshNode *)operator_new(0xa8);
            local_228.ptr = (MaterialNode *)plVar18[0x1a];
            local_278 = pGVar19;
            if (local_228.ptr != (MaterialNode *)0x0) {
              (*((local_228.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
            }
            GridMeshNode::GridMeshNode
                      (pGVar19,&local_228,*(BBox1f *)(plVar18 + 0xd),
                       plVar18[0xf] - plVar18[0xe] >> 5);
            (*(pGVar19->super_Node).super_RefCount._vptr_RefCount[2])(pGVar19);
            if (local_228.ptr != (MaterialNode *)0x0) {
              (*((local_228.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
            }
            local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_offset = 0;
            local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset = 0;
            local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage = (_Bit_pointer)0x0;
            sVar20 = (**(code **)(*plVar18 + 0x70))(plVar18);
            std::vector<bool,_std::allocator<bool>_>::resize(&local_250,sVar20,false);
            if (((long)local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                (long)local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                (ulong)local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0) {
              uVar32 = 0;
              do {
                uVar37 = uVar32 + 0x3f;
                if (-1 < (long)uVar32) {
                  uVar37 = uVar32;
                }
                bVar9 = (byte)uVar32 & 0x3f;
                local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [((long)uVar37 >> 6) +
                 ((ulong)((uVar32 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                     local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [((long)uVar37 >> 6) +
                      ((ulong)((uVar32 & 0x800000000000003f) < 0x8000000000000001) - 1)] &
                     (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
                uVar32 = uVar32 + 1;
              } while (uVar32 < (ulong)local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                       _M_offset +
                                ((long)local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                       _M_p -
                                (long)local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p) * 8);
            }
            sVar20 = (**(code **)(*plVar18 + 0x70))(plVar18);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&faces,sVar20,(allocator_type *)&left);
            if (faces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                faces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar32 = 0;
              do {
                faces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar32] = 4;
                uVar32 = uVar32 + 1;
              } while (uVar32 < (ulong)((long)faces.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)faces.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 2));
            }
            pRVar21 = (RTCGeometry)rtcNewGeometry(g_device,8);
            puVar14 = faces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar22 = (**(code **)(*plVar18 + 0x70))(plVar18);
            rtcSetSharedGeometryBuffer(pRVar21,0x10,0,0x5001,puVar14,0,4,uVar22);
            lVar26 = plVar18[0x17];
            lVar23 = (**(code **)(*plVar18 + 0x70))(plVar18);
            rtcSetSharedGeometryBuffer(pRVar21,0,0,0x5001,lVar26,0,4,lVar23 << 2);
            rtcSetSharedGeometryBuffer
                      (pRVar21,1,0,0x9003,*(undefined8 *)(plVar18[0xe] + 0x18),0,0x10,
                       *(undefined8 *)(plVar18[0xe] + 8));
            rtcCommitGeometry(pRVar21);
            this_00 = &pGVar19->grids;
            uVar27 = 0;
            local_260 = pRVar21;
            do {
              uVar32 = (**(code **)(*plVar18 + 0x70))(plVar18);
              if (uVar32 <= uVar27) {
                rtcReleaseGeometry(pRVar21);
                (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)pGVar19;
                (*(pGVar19->super_Node).super_RefCount._vptr_RefCount[2])(pGVar19);
                if (faces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(faces.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                    (_Bit_type *)0x0) {
                  operator_delete(local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
                }
                (*(pGVar19->super_Node).super_RefCount._vptr_RefCount[3])(pGVar19);
                (**(code **)(*plVar18 + 0x18))(plVar18);
                return (Ref<embree::SceneGraph::Node>)this;
              }
              if ((local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar27 >> 6] >>
                   ((ulong)uVar27 & 0x3f) & 1) == 0) {
                local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar27 >> 6] =
                     local_250.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar27 >> 6] |
                     1L << ((byte)uVar27 & 0x3f);
                edge = rtcGetGeometryFirstHalfEdge(pRVar21);
                left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
                left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
                left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
                left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
                left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
                left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
                left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
                left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
                left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_map = (_Map_pointer)0x0;
                left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_map_size = 0;
                std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map
                          (&left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>,0);
                right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
                right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
                right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
                right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
                right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
                right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
                right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
                right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
                right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_map = (_Map_pointer)0x0;
                right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_map_size = 0;
                std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map
                          ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&right,0);
                top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
                top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
                top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
                top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
                top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
                top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
                top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
                top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
                top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_map = (_Map_pointer)0x0;
                top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_map_size = 0;
                std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map
                          (&top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>,0);
                bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
                bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
                bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
                bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
                bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
                bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
                bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
                bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
                bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_map = (_Map_pointer)0x0;
                bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_map_size = 0;
                std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map
                          (&bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>,0)
                ;
                if (left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur ==
                    left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
                  std::deque<unsigned_int,std::allocator<unsigned_int>>::
                  _M_push_back_aux<unsigned_int_const&>
                            ((deque<unsigned_int,std::allocator<unsigned_int>> *)&left,&edge);
                }
                else {
                  *left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur = edge;
                  left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur =
                       left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_cur + 1;
                }
                edge = rtcGetGeometryNextHalfEdge(pRVar21,edge);
                if (bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur ==
                    bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
                  std::deque<unsigned_int,std::allocator<unsigned_int>>::
                  _M_push_back_aux<unsigned_int_const&>
                            ((deque<unsigned_int,std::allocator<unsigned_int>> *)&bottom,&edge);
                }
                else {
                  *bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur = edge;
                  bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur =
                       bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Deque_impl_data._M_finish._M_cur + 1;
                }
                edge = rtcGetGeometryNextHalfEdge(pRVar21,edge);
                if (right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur ==
                    right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
                  std::deque<unsigned_int,std::allocator<unsigned_int>>::
                  _M_push_back_aux<unsigned_int_const&>
                            ((deque<unsigned_int,std::allocator<unsigned_int>> *)&right,&edge);
                }
                else {
                  *right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur = edge;
                  right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur =
                       right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_cur + 1;
                }
                edge = rtcGetGeometryNextHalfEdge(pRVar21,edge);
                if (top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur ==
                    top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
                  std::deque<unsigned_int,std::allocator<unsigned_int>>::
                  _M_push_back_aux<unsigned_int_const&>
                            ((deque<unsigned_int,std::allocator<unsigned_int>> *)&top,&edge);
                }
                else {
                  *top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur = edge;
                  top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur =
                       top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_cur + 1;
                }
                edge = rtcGetGeometryNextHalfEdge(pRVar21,edge);
                uVar30 = 1;
                uVar35 = 1;
                do {
                  pRVar21 = local_260;
                  bVar15 = extend_grid(local_260,&local_250,&left,&top,&right);
                  local_258 = CONCAT71(local_258._1_7_,bVar15);
                  bVar15 = extend_grid(pRVar21,&local_250,&top,&right,&bottom);
                  bVar16 = extend_grid(pRVar21,&local_250,&right,&bottom,&left);
                  bVar17 = extend_grid(pRVar21,&local_250,&bottom,&left,&top);
                  iVar31 = uVar30 + bVar15;
                  uVar30 = iVar31 + (uint)bVar17;
                  iVar36 = uVar35 + (byte)local_258;
                  uVar35 = iVar36 + (uint)bVar16;
                  if (((byte)((bVar16 || bVar17) | (byte)local_258 | bVar15) != 1) ||
                     (0x7fff < (uint)bVar17 + iVar31 + 2)) break;
                } while ((uint)bVar16 + iVar36 + 2 < 0x8000);
                local_208._0_4_ =
                     *(undefined4 *)
                      &((local_278->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->size_active;
                iVar31 = uVar30 + 1;
                uVar29 = (undefined2)(uVar35 + 1);
                local_208.size_active._0_4_ = CONCAT22(uVar29,(short)iVar31);
                __position._M_current =
                     (local_278->grids).
                     super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_208._4_4_ = iVar31;
                if (__position._M_current ==
                    (local_278->grids).
                    super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                  ::_M_realloc_insert<embree::SceneGraph::GridMeshNode::Grid>
                            (this_00,__position,(Grid *)&local_208);
                }
                else {
                  (__position._M_current)->resX = (short)iVar31;
                  (__position._M_current)->resY = uVar29;
                  (__position._M_current)->startVtx = local_208._0_4_;
                  (__position._M_current)->lineStride = iVar31;
                  ppGVar2 = &(local_278->grids).
                             super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppGVar2 = *ppGVar2 + 1;
                }
                lVar26 = local_270[0xe];
                if (local_270[0xf] != lVar26) {
                  local_258 = (ulong)(iVar31 * (uVar35 + 1));
                  size = local_258 << 4;
                  uVar32 = 0;
                  do {
                    uVar37 = local_258;
                    plVar18 = local_270;
                    pGVar19 = local_278;
                    local_208.size_active = 0;
                    local_208.size_alloced = 0;
                    local_208.items = (Vec3fa *)0x0;
                    if (local_258 == 0) {
                      local_268 = (Vec3fa *)0x0;
                      pRVar21 = local_260;
                    }
                    else {
                      local_268 = (Vec3fa *)0x0;
                      pVVar24 = (Vec3fa *)alignedMalloc(size,0x10);
                      pRVar21 = local_260;
                      local_268 = pVVar24;
                      local_208.items = pVVar24;
                      alignedFree((void *)0x0);
                      local_208.size_alloced = uVar37;
                      lVar26 = plVar18[0xe];
                      local_268 = pVVar24;
                    }
                    local_208.size_active = uVar37;
                    gather_grid(pRVar21,&local_208,(ulong)uVar30,(ulong)uVar35,(uint *)plVar18[0x17]
                                ,(avector<Vec3fa> *)(lVar26 + uVar32 * 0x20),
                                *left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_cur);
                    pVVar24 = local_268;
                    if (uVar37 != 0) {
                      uVar37 = 0;
                      do {
                        pvVar7 = (pGVar19->positions).
                                 super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        pVVar25 = pVVar24 + uVar37;
                        fVar10 = (pVVar25->field_0).m128[0];
                        fVar11 = (pVVar25->field_0).m128[1];
                        fVar12 = (pVVar25->field_0).m128[2];
                        fVar13 = (pVVar25->field_0).m128[3];
                        sVar8 = pvVar7[uVar32].size_active;
                        uVar28 = pvVar7[uVar32].size_alloced;
                        uVar1 = sVar8 + 1;
                        if (uVar28 < uVar1) {
                          uVar34 = uVar1;
                          uVar33 = uVar28;
                          if (uVar28 != 0) {
                            do {
                              uVar34 = uVar33 * 2 + (ulong)(uVar33 * 2 == 0);
                              uVar33 = uVar34;
                            } while (uVar34 < uVar1);
                          }
                          if (uVar28 != uVar34) {
                            pVVar24 = pvVar7[uVar32].items;
                            pVVar25 = (Vec3fa *)alignedMalloc(uVar34 << 4,0x10);
                            pvVar7[uVar32].items = pVVar25;
                            if (pvVar7[uVar32].size_active != 0) {
                              lVar26 = 0;
                              uVar28 = 0;
                              do {
                                puVar3 = (undefined8 *)((long)&pVVar24->field_0 + lVar26);
                                uVar22 = puVar3[1];
                                puVar4 = (undefined8 *)
                                         ((long)&(pvVar7[uVar32].items)->field_0 + lVar26);
                                *puVar4 = *puVar3;
                                puVar4[1] = uVar22;
                                uVar28 = uVar28 + 1;
                                lVar26 = lVar26 + 0x10;
                              } while (uVar28 < pvVar7[uVar32].size_active);
                            }
                            alignedFree(pVVar24);
                            pvVar7[uVar32].size_active = sVar8;
                            pvVar7[uVar32].size_alloced = uVar34;
                            pVVar24 = local_268;
                          }
                        }
                        pvVar7[uVar32].size_active = uVar1;
                        pVVar25 = pvVar7[uVar32].items + sVar8;
                        (pVVar25->field_0).m128[0] = fVar10;
                        (pVVar25->field_0).m128[1] = fVar11;
                        (pVVar25->field_0).m128[2] = fVar12;
                        (pVVar25->field_0).m128[3] = fVar13;
                        uVar37 = uVar37 + 1;
                        pGVar19 = local_278;
                      } while (uVar37 != local_258);
                    }
                    alignedFree(pVVar24);
                    uVar32 = uVar32 + 1;
                    lVar26 = local_270[0xe];
                  } while (uVar32 < (ulong)(local_270[0xf] - lVar26 >> 5));
                }
                std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                          (&bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
                std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                          (&top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
                std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                          (&right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
                std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                          (&left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
                this = (SceneGraph *)local_1e8;
                pRVar21 = local_260;
                plVar18 = local_270;
                pGVar19 = local_278;
              }
              uVar27 = uVar27 + 1;
            } while( true );
          }
        }
        else {
          (**(code **)(*plVar18 + 0x10))(plVar18);
          lVar26 = plVar18[0xd];
          if (plVar18[0xe] != lVar26) {
            uVar32 = 0;
            do {
              local_220.ptr = *(Node **)(lVar26 + uVar32 * 8);
              if (local_220.ptr != (Node *)0x0) {
                (*((local_220.ptr)->super_RefCount)._vptr_RefCount[2])();
              }
              my_merge_quads_to_grids((SceneGraph *)&left,&local_220);
              lVar26 = plVar18[0xd];
              plVar6 = *(long **)(lVar26 + uVar32 * 8);
              if (plVar6 != (long *)0x0) {
                (**(code **)(*plVar6 + 0x18))();
              }
              *(_Map_pointer *)(lVar26 + uVar32 * 8) =
                   left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Deque_impl_data._M_map;
              if (local_220.ptr != (Node *)0x0) {
                (*((local_220.ptr)->super_RefCount)._vptr_RefCount[3])();
              }
              uVar32 = uVar32 + 1;
              lVar26 = plVar18[0xd];
            } while (uVar32 < (ulong)(plVar18[0xe] - lVar26 >> 3));
          }
          (**(code **)(*plVar18 + 0x18))(plVar18);
          this = (SceneGraph *)local_1e8;
        }
      }
      else {
        (**(code **)(*plVar18 + 0x10))(plVar18);
        local_218.ptr = (Node *)plVar18[0x10];
        if (local_218.ptr != (Node *)0x0) {
          (*((local_218.ptr)->super_RefCount)._vptr_RefCount[2])();
        }
        my_merge_quads_to_grids((SceneGraph *)&left,&local_218);
        if ((long *)plVar18[0x10] != (long *)0x0) {
          (**(code **)(*(long *)plVar18[0x10] + 0x18))();
        }
        plVar18[0x10] =
             (long)left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Deque_impl_data._M_map;
        if (local_218.ptr != (Node *)0x0) {
          (*((local_218.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        (**(code **)(*plVar18 + 0x18))(plVar18);
      }
    }
    else {
      (**(code **)(*plVar18 + 0x10))(plVar18);
      local_210.ptr = (Node *)plVar18[0x13];
      if (local_210.ptr != (Node *)0x0) {
        (*((local_210.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      my_merge_quads_to_grids((SceneGraph *)&left,&local_210);
      if ((long *)plVar18[0x13] != (long *)0x0) {
        (**(code **)(*(long *)plVar18[0x13] + 0x18))();
      }
      plVar18[0x13] =
           (long)left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_map;
      if (local_210.ptr != (Node *)0x0) {
        (*((local_210.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      (**(code **)(*plVar18 + 0x18))(plVar18);
    }
  }
  (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
  node->ptr = (Node *)0x0;
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::my_merge_quads_to_grids(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = my_merge_quads_to_grids(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = my_merge_quads_to_grids(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = my_merge_quads_to_grids(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::QuadMeshNode> qmesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      Ref<SceneGraph::GridMeshNode> gmesh = new SceneGraph::GridMeshNode(qmesh->material,qmesh->time_range,qmesh->numTimeSteps());
      
      std::vector<bool> visited;
      visited.resize(qmesh->numPrimitives());
      for (size_t i=0; i<visited.size(); i++) visited[i] = false;
      std::vector<unsigned int> faces(qmesh->numPrimitives());
      for (size_t i=0; i<faces.size(); i++) faces[i] = 4;

      /* create temporary subdiv mesh to get access to mesh topology */
      RTCGeometry geom = rtcNewGeometry(g_device,RTC_GEOMETRY_TYPE_SUBDIVISION);
      rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_FACE,   0, RTC_FORMAT_UINT,   faces.data(), 0, sizeof(unsigned int), qmesh->numPrimitives());
      rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX,  0, RTC_FORMAT_UINT,   qmesh->quads.data(), 0, sizeof(unsigned int), 4*qmesh->numPrimitives());
      rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT3, qmesh->positions[0].data(), 0, sizeof(Vec3fa), qmesh->numVertices());
      rtcCommitGeometry(geom);

      /* iterate over mesh and collect all grids */
      for (unsigned int i=0; i<qmesh->numPrimitives(); i++)
      {
        /* skip face if already added to some grid */
        if (visited[i]) continue;
        visited[i] = true;

        /* initialize grid with start quad */
        unsigned int edge = rtcGetGeometryFirstHalfEdge(geom,i);
        std::deque<unsigned int> left, right, top, bottom;
        left.push_back(edge);   edge = rtcGetGeometryNextHalfEdge(geom,edge);
        bottom.push_back(edge); edge = rtcGetGeometryNextHalfEdge(geom,edge);
        right.push_back(edge);  edge = rtcGetGeometryNextHalfEdge(geom,edge);
        top.push_back(edge);    edge = rtcGetGeometryNextHalfEdge(geom,edge);
        assert(edge == rtcGetGeometryFirstHalfEdge(geom,i));
        
        /* extend grid unless no longer possible */
        unsigned int width = 1;
        unsigned int height = 1;
        while (true)
        {
          const bool extended_top    = extend_grid(geom,visited,left,top,right);
          const bool extended_right  = extend_grid(geom,visited,top,right,bottom);
          const bool extended_bottom = extend_grid(geom,visited,right,bottom,left);
          const bool extended_left   = extend_grid(geom,visited,bottom,left,top);
          width  += extended_left + extended_right;
          height += extended_top  + extended_bottom;
          if (!extended_top && !extended_right && !extended_bottom && !extended_left) break;
          if (width+2  > SceneGraph::GridMeshNode::GRID_RES_MAX) break;
          if (height+2 > SceneGraph::GridMeshNode::GRID_RES_MAX) break;
        }
        
        /* add new grid to grid mesh */
        unsigned int startVertex = (unsigned int) gmesh->positions[0].size();
        gmesh->grids.push_back(SceneGraph::GridMeshNode::Grid(startVertex,width+1,width+1,height+1));

        /* gather all vertices of grid */
        for (size_t t=0; t<qmesh->numTimeSteps(); t++)
        {
          avector<Vec3fa> positions;
          positions.resize((width+1)*(height+1));
          gather_grid(geom,positions,width,height,(unsigned int*)qmesh->quads.data(), qmesh->positions[t], left.front());
          for (size_t i=0; i<positions.size(); i++)
            gmesh->positions[t].push_back(positions[i]);
        }
      }

      rtcReleaseGeometry(geom);

      return gmesh.dynamicCast<SceneGraph::Node>();
    }
    return node;
  }